

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall TiXmlElement::TiXmlElement(TiXmlElement *this,TiXmlElement *copy)

{
  TiXmlElement *copy_local;
  TiXmlElement *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,TINYXML_ELEMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlElement_0030a760;
  TiXmlAttributeSet::TiXmlAttributeSet(&this->attributeSet);
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  CopyTo(copy,this);
  return;
}

Assistant:

TiXmlElement::TiXmlElement( const TiXmlElement& copy)
	: TiXmlNode( TiXmlNode::TINYXML_ELEMENT )
{
	firstChild = lastChild = 0;
	copy.CopyTo( this );	
}